

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateRSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  ulong uVar1;
  CK_RV CVar2;
  void *pvVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  Session *this_00;
  Token *this_01;
  CryptoFactory *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  char *pcVar11;
  ByteString *pBVar12;
  CK_ULONG CVar13;
  long *plVar14;
  unsigned_long *puVar15;
  CK_ULONG CVar16;
  CK_ULONG i_1;
  CK_ULONG i;
  size_t inBitLen;
  ulong uVar17;
  bool bVar18;
  CK_RV CStack_5e0;
  AsymmetricKeyPair *kp;
  OSAttribute local_5b0;
  long *local_510;
  CK_SESSION_HANDLE local_508;
  CK_ULONG local_500;
  ByteString publicExponent;
  ByteString modulus;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  RSAParameters p;
  ByteString exponent;
  CK_ATTRIBUTE publicKeyAttribs [32];
  undefined4 extraout_var_01;
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  local_500 = ulPublicKeyAttributeCount;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  this_01 = Session::getToken(this_00);
  if (this_01 == (Token *)0x0) {
    return 5;
  }
  local_508 = hSession;
  ByteString::ByteString(&exponent,"010001");
  puVar15 = &pPublicKeyTemplate->ulValueLen;
  inBitLen = 0;
  CVar16 = local_500;
  while (bVar18 = CVar16 != 0, CVar16 = CVar16 - 1, bVar18) {
    if (((_CK_ATTRIBUTE *)(puVar15 + -2))->type == 0x122) {
      ByteString::ByteString((ByteString *)publicKeyAttribs,(uchar *)puVar15[-1],*puVar15);
      ByteString::operator=(&exponent,(ByteString *)publicKeyAttribs);
      ByteString::~ByteString((ByteString *)publicKeyAttribs);
    }
    else if (((_CK_ATTRIBUTE *)(puVar15 + -2))->type == 0x121) {
      if (*puVar15 != 8) {
        softHSMLog(6,"generateRSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x20de,"CKA_MODULUS_BITS does not have the size of CK_ULONG");
        CStack_5e0 = 0x13;
        goto LAB_0013c079;
      }
      inBitLen = *(size_t *)puVar15[-1];
    }
    puVar15 = puVar15 + 3;
  }
  if (inBitLen == 0) {
    CStack_5e0 = 0xd0;
    softHSMLog(6,"generateRSA",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x20ed,"Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
    goto LAB_0013c079;
  }
  RSAParameters::RSAParameters(&p);
  RSAParameters::setE(&p,&exponent);
  RSAParameters::setBitLength(&p,inBitLen);
  kp = (AsymmetricKeyPair *)0x0;
  pCVar7 = CryptoFactory::i();
  iVar6 = (*pCVar7->_vptr_CryptoFactory[2])(pCVar7,1);
  plVar9 = (long *)CONCAT44(extraout_var,iVar6);
  CStack_5e0 = 5;
  if (plVar9 != (long *)0x0) {
    cVar4 = (**(code **)(*plVar9 + 0x60))(plVar9,&kp,&p,0);
    if (cVar4 == '\0') {
      softHSMLog(3,"generateRSA",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x20fd,"Could not generate key pair");
      pCVar7 = CryptoFactory::i();
      (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,plVar9);
    }
    else {
      iVar6 = (*(kp->super_Serialisable)._vptr_Serialisable[3])();
      local_510 = (long *)CONCAT44(extraout_var_00,iVar6);
      iVar6 = (*(kp->super_Serialisable)._vptr_Serialisable[5])();
      plVar8 = (long *)CONCAT44(extraout_var_01,iVar6);
      publicKeyClass = 2;
      publicKeyType = 0;
      memset(publicKeyAttribs,0,0x300);
      publicKeyAttribs[0].ulValueLen = 8;
      publicKeyAttribs[1].type = 1;
      publicKeyAttribs[1].pValue = &isPublicKeyOnToken;
      publicKeyAttribs[1].ulValueLen = 1;
      publicKeyAttribs[2].type = 2;
      publicKeyAttribs[2].pValue = &isPublicKeyPrivate;
      publicKeyAttribs[2].ulValueLen = 1;
      publicKeyAttribs[3].type = 0x100;
      publicKeyAttribs[3].ulValueLen = 8;
      CVar16 = 4;
      for (uVar17 = 0; (local_500 < 0x1d && (uVar17 < local_500)); uVar17 = uVar17 + 1) {
        uVar1 = pPublicKeyTemplate->type;
        CVar13 = CVar16;
        if ((2 < uVar1) && ((uVar1 != 0x100 && (uVar1 != 0x122)))) {
          CVar13 = CVar16 + 1;
          publicKeyAttribs[CVar16].ulValueLen = pPublicKeyTemplate->ulValueLen;
          pvVar3 = pPublicKeyTemplate->pValue;
          publicKeyAttribs[CVar16].type = pPublicKeyTemplate->type;
          publicKeyAttribs[CVar16].pValue = pvVar3;
        }
        pPublicKeyTemplate = pPublicKeyTemplate + 1;
        CVar16 = CVar13;
      }
      CStack_5e0 = 0xd1;
      publicKeyAttribs[0].pValue = &publicKeyClass;
      publicKeyAttribs[3].pValue = &publicKeyType;
      if ((local_500 < 0x1d) &&
         (CStack_5e0 = CreateObject(this,local_508,publicKeyAttribs,CVar16,phPublicKey,4),
         CStack_5e0 == 0)) {
        plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
        CStack_5e0 = 6;
        CVar2 = 6;
        if ((plVar10 != (long *)0x0) &&
           ((cVar4 = (**(code **)(*plVar10 + 0x50))(plVar10), CStack_5e0 = CVar2, cVar4 != '\0' &&
            (cVar4 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar4 != '\0')))) {
          OSAttribute::OSAttribute(&local_5b0,true);
          cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,&local_5b0);
          OSAttribute::~OSAttribute(&local_5b0);
          if (cVar4 == '\0') {
            cVar4 = '\0';
            plVar14 = local_510;
          }
          else {
            OSAttribute::OSAttribute(&local_5b0,0);
            plVar14 = local_510;
            cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,&local_5b0);
            OSAttribute::~OSAttribute(&local_5b0);
          }
          ByteString::ByteString(&modulus);
          ByteString::ByteString(&publicExponent);
          if (isPublicKeyPrivate == '\0') {
            pBVar12 = (ByteString *)(**(code **)(*plVar14 + 0x40))(plVar14);
            ByteString::operator=(&modulus,pBVar12);
            pBVar12 = (ByteString *)(**(code **)(*plVar14 + 0x48))(plVar14);
            ByteString::operator=(&publicExponent,pBVar12);
          }
          else {
            pcVar11 = (char *)(**(code **)(*plVar14 + 0x40))(plVar14);
            Token::encrypt(this_01,pcVar11,(int)&modulus);
            pcVar11 = (char *)(**(code **)(*plVar14 + 0x48))(plVar14);
            Token::encrypt(this_01,pcVar11,(int)&publicExponent);
          }
          if (cVar4 != '\0') {
            OSAttribute::OSAttribute(&local_5b0,&modulus);
            cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x120,&local_5b0);
            OSAttribute::~OSAttribute(&local_5b0);
            if (cVar4 != '\0') {
              OSAttribute::OSAttribute(&local_5b0,&publicExponent);
              cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x122,&local_5b0);
              OSAttribute::~OSAttribute(&local_5b0);
              if (cVar4 != '\0') {
                cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10);
                ByteString::~ByteString(&publicExponent);
                ByteString::~ByteString(&modulus);
                if (cVar4 != '\0') {
                  privateKeyClass = 3;
                  privateKeyType = 0;
                  memset(publicKeyAttribs,0,0x300);
                  publicKeyAttribs[0].ulValueLen = 8;
                  publicKeyAttribs[1].type = 1;
                  publicKeyAttribs[1].pValue = &isPrivateKeyOnToken;
                  publicKeyAttribs[1].ulValueLen = 1;
                  publicKeyAttribs[2].type = 2;
                  publicKeyAttribs[2].pValue = &isPrivateKeyPrivate;
                  publicKeyAttribs[2].ulValueLen = 1;
                  publicKeyAttribs[3].type = 0x100;
                  publicKeyAttribs[3].ulValueLen = 8;
                  CVar16 = 4;
                  for (uVar17 = 0;
                      (ulPrivateKeyAttributeCount < 0x1d && (uVar17 < ulPrivateKeyAttributeCount));
                      uVar17 = uVar17 + 1) {
                    CVar13 = CVar16;
                    if ((2 < pPrivateKeyTemplate->type) && (pPrivateKeyTemplate->type != 0x100)) {
                      CVar13 = CVar16 + 1;
                      publicKeyAttribs[CVar16].ulValueLen = pPrivateKeyTemplate->ulValueLen;
                      pvVar3 = pPrivateKeyTemplate->pValue;
                      publicKeyAttribs[CVar16].type = pPrivateKeyTemplate->type;
                      publicKeyAttribs[CVar16].pValue = pvVar3;
                    }
                    pPrivateKeyTemplate = pPrivateKeyTemplate + 1;
                    CVar16 = CVar13;
                  }
                  CStack_5e0 = 0xd1;
                  publicKeyAttribs[0].pValue = &privateKeyClass;
                  publicKeyAttribs[3].pValue = &privateKeyType;
                  if ((ulPrivateKeyAttributeCount < 0x1d) &&
                     (CStack_5e0 = CreateObject(this,local_508,publicKeyAttribs,CVar16,phPrivateKey,
                                                4), CStack_5e0 == 0)) {
                    plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
                    CStack_5e0 = 6;
                    if ((plVar10 != (long *)0x0) &&
                       ((cVar4 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar4 != '\0' &&
                        (cVar4 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar4 != '\0')))) {
                      OSAttribute::OSAttribute(&local_5b0,true);
                      cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,&local_5b0);
                      OSAttribute::~OSAttribute(&local_5b0);
                      if (cVar4 == '\0') {
                        cVar4 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_5b0,0);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                      }
                      bVar18 = (bool)(**(code **)(*plVar10 + 0x20))(plVar10,0x103,0);
                      if (cVar4 == '\0') {
                        cVar4 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_5b0,bVar18);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x165,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                      }
                      bVar5 = (**(code **)(*plVar10 + 0x20))(plVar10,0x162,0);
                      if (cVar4 == '\0') {
                        cVar4 = '\0';
                      }
                      else {
                        OSAttribute::OSAttribute(&local_5b0,(bool)(bVar5 ^ 1));
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x164,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                      }
                      ByteString::ByteString(&modulus);
                      ByteString::ByteString(&publicExponent);
                      ByteString::ByteString((ByteString *)&publicKeyClass);
                      ByteString::ByteString((ByteString *)&publicKeyType);
                      ByteString::ByteString(&prime2);
                      ByteString::ByteString(&exponent1);
                      ByteString::ByteString(&exponent2);
                      ByteString::ByteString(&coefficient);
                      if (isPrivateKeyPrivate == '\0') {
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0xb0))(plVar8);
                        ByteString::operator=(&modulus,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0xb8))();
                        ByteString::operator=(&publicExponent,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0xa8))();
                        ByteString::operator=((ByteString *)&publicKeyClass,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0x80))();
                        ByteString::operator=((ByteString *)&publicKeyType,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0x88))();
                        ByteString::operator=(&prime2,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0x98))();
                        ByteString::operator=(&exponent1,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0xa0))();
                        ByteString::operator=(&exponent2,pBVar12);
                        pBVar12 = (ByteString *)(**(code **)(*plVar8 + 0x90))();
                        ByteString::operator=(&coefficient,pBVar12);
                      }
                      else {
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0xb0))(plVar8);
                        Token::encrypt(this_01,pcVar11,(int)&modulus);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0xb8))();
                        Token::encrypt(this_01,pcVar11,(int)&publicExponent);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0xa8))();
                        Token::encrypt(this_01,pcVar11,(int)&publicKeyClass);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0x80))();
                        Token::encrypt(this_01,pcVar11,(int)&publicKeyType);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0x88))();
                        Token::encrypt(this_01,pcVar11,(int)&prime2);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0x98))();
                        Token::encrypt(this_01,pcVar11,(int)&exponent1);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0xa0))();
                        Token::encrypt(this_01,pcVar11,(int)&exponent2);
                        pcVar11 = (char *)(**(code **)(*plVar8 + 0x90))();
                        Token::encrypt(this_01,pcVar11,(int)&coefficient);
                      }
                      if (cVar4 == '\0') {
LAB_0013c97f:
                        (**(code **)(*plVar10 + 0x68))(plVar10);
                        CStack_5e0 = 6;
                      }
                      else {
                        OSAttribute::OSAttribute(&local_5b0,&modulus);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x120,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,&publicExponent);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x122,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,(ByteString *)&publicKeyClass);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x123,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,(ByteString *)&publicKeyType);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x124,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,&prime2);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x125,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,&exponent1);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x126,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,&exponent2);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x127,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        OSAttribute::OSAttribute(&local_5b0,&coefficient);
                        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x128,&local_5b0);
                        OSAttribute::~OSAttribute(&local_5b0);
                        if (cVar4 == '\0') goto LAB_0013c97f;
                        cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10);
                        CStack_5e0 = 6;
                        if (cVar4 != '\0') {
                          CStack_5e0 = 0;
                        }
                      }
                      ByteString::~ByteString(&coefficient);
                      ByteString::~ByteString(&exponent2);
                      ByteString::~ByteString(&exponent1);
                      ByteString::~ByteString(&prime2);
                      ByteString::~ByteString((ByteString *)&publicKeyType);
                      ByteString::~ByteString((ByteString *)&publicKeyClass);
                      ByteString::~ByteString(&publicExponent);
                      ByteString::~ByteString(&modulus);
                    }
                  }
                }
                goto LAB_0013bfbd;
              }
            }
          }
          (**(code **)(*plVar10 + 0x68))(plVar10);
          ByteString::~ByteString(&publicExponent);
          ByteString::~ByteString(&modulus);
        }
      }
LAB_0013bfbd:
      (**(code **)(*plVar9 + 0xc0))(plVar9,kp);
      pCVar7 = CryptoFactory::i();
      (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,plVar9);
      if (CStack_5e0 == 0) {
        CStack_5e0 = 0;
      }
      else {
        if (*phPrivateKey != 0) {
          plVar9 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
          HandleManager::destroyObject(this->handleManager,*phPrivateKey);
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x70))(plVar9);
          }
          *phPrivateKey = 0;
        }
        if (*phPublicKey != 0) {
          plVar9 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
          HandleManager::destroyObject(this->handleManager,*phPublicKey);
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x70))(plVar9);
          }
          *phPublicKey = 0;
        }
      }
    }
  }
  RSAParameters::~RSAParameters(&p);
LAB_0013c079:
  ByteString::~ByteString(&exponent);
  return CStack_5e0;
}

Assistant:

CK_RV SoftHSM::generateRSA
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate
)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information: bitlen and public exponent
	size_t bitLen = 0;
	ByteString exponent("010001");
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_MODULUS_BITS:
				if (pPublicKeyTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_MODULUS_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pPublicKeyTemplate[i].pValue;
				break;
			case CKA_PUBLIC_EXPONENT:
				exponent = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// CKA_MODULUS_BITS must be specified to be able to generate a key pair.
	if (bitLen == 0) {
		INFO_MSG("Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	RSAParameters p;
	p.setE(exponent);
	p.setBitLength(bitLen);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* rsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
	if (rsa == NULL)
		return CKR_GENERAL_ERROR;
	if (!rsa->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);
		return CKR_GENERAL_ERROR;
	}

	RSAPublicKey* pub = (RSAPublicKey*) kp->getPublicKey();
	RSAPrivateKey* priv = (RSAPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_RSA;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
				case CKA_PUBLIC_EXPONENT:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// RSA Public Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getN(), modulus);
					token->encrypt(pub->getE(), publicExponent);
				}
				else
				{
					modulus = pub->getN();
					publicExponent = pub->getE();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_RSA;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// RSA Private Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				ByteString privateExponent;
				ByteString prime1;
				ByteString prime2;
				ByteString exponent1;
				ByteString exponent2;
				ByteString coefficient;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getN(), modulus);
					token->encrypt(priv->getE(), publicExponent);
					token->encrypt(priv->getD(), privateExponent);
					token->encrypt(priv->getP(), prime1);
					token->encrypt(priv->getQ(), prime2);
					token->encrypt(priv->getDP1(), exponent1);
					token->encrypt(priv->getDQ1(), exponent2);
					token->encrypt(priv->getPQ(), coefficient);
				}
				else
				{
					modulus = priv->getN();
					publicExponent = priv->getE();
					privateExponent = priv->getD();
					prime1 = priv->getP();
					prime2 = priv->getQ();
					exponent1 =  priv->getDP1();
					exponent2 = priv->getDQ1();
					coefficient = priv->getPQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIVATE_EXPONENT, privateExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_1, prime1);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_2, prime2);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_1,exponent1);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_2, exponent2);
				bOK = bOK && osobject->setAttribute(CKA_COEFFICIENT, coefficient);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	rsa->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}